

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_4::ValidateDecorationGroup(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint id;
  Op OVar2;
  spv_result_t sVar3;
  Instruction *this;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *this_00;
  reference ppVar4;
  DiagnosticStream *pDVar5;
  DiagnosticStream local_238;
  Instruction *local_60;
  Instruction *use;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> pair;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
  *__range2;
  Instruction *decoration_group;
  uint decoration_group_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,0);
  this = ValidationState_t::FindDef(_,id);
  this_00 = Instruction::uses(this);
  __end2 = std::
           vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
           ::begin(this_00);
  pair._8_8_ = std::
               vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
                                *)&pair.second);
    if (!bVar1) {
      return SPV_SUCCESS;
    }
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
             ::operator*(&__end2);
    local_60 = ppVar4->first;
    pair.first = *(Instruction **)&ppVar4->second;
    use = local_60;
    OVar2 = Instruction::opcode(local_60);
    if ((((OVar2 != OpDecorate) && (OVar2 = Instruction::opcode(local_60), OVar2 != OpGroupDecorate)
         ) && (OVar2 = Instruction::opcode(local_60), OVar2 != OpGroupMemberDecorate)) &&
       (((OVar2 = Instruction::opcode(local_60), OVar2 != OpName &&
         (OVar2 = Instruction::opcode(local_60), OVar2 != OpDecorateId)) &&
        (bVar1 = Instruction::IsNonSemantic(local_60), !bVar1)))) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>_>
    ::operator++(&__end2);
  }
  ValidationState_t::diag(&local_238,_,SPV_ERROR_INVALID_ID,inst);
  pDVar5 = DiagnosticStream::operator<<
                     (&local_238,(char (*) [41])"Result id of OpDecorationGroup can only ");
  pDVar5 = DiagnosticStream::operator<<
                     (pDVar5,(char (*) [41])"be targeted by OpName, OpGroupDecorate, ");
  pDVar5 = DiagnosticStream::operator<<
                     (pDVar5,(char (*) [52])"OpDecorate, OpDecorateId, and OpGroupMemberDecorate");
  sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
  DiagnosticStream::~DiagnosticStream(&local_238);
  return sVar3;
}

Assistant:

spv_result_t ValidateDecorationGroup(ValidationState_t& _,
                                     const Instruction* inst) {
  const auto decoration_group_id = inst->GetOperandAs<uint32_t>(0);
  const auto decoration_group = _.FindDef(decoration_group_id);
  for (auto pair : decoration_group->uses()) {
    auto use = pair.first;
    if (use->opcode() != spv::Op::OpDecorate &&
        use->opcode() != spv::Op::OpGroupDecorate &&
        use->opcode() != spv::Op::OpGroupMemberDecorate &&
        use->opcode() != spv::Op::OpName &&
        use->opcode() != spv::Op::OpDecorateId && !use->IsNonSemantic()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Result id of OpDecorationGroup can only "
             << "be targeted by OpName, OpGroupDecorate, "
             << "OpDecorate, OpDecorateId, and OpGroupMemberDecorate";
    }
  }
  return SPV_SUCCESS;
}